

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crm_test.cc
# Opt level: O0

int test_delete_label(void)

{
  code *pcVar1;
  char *__s;
  CrmDeleteLabelRequestType *pCVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_169;
  int ret;
  HttpTestListener *local_148;
  HttpTestListener *listener;
  string local_138;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [55];
  allocator<char> local_b1;
  string local_b0 [32];
  CrmDeleteLabelRequestType *local_90;
  Crm *crm;
  CrmDeleteLabelResponseType resp;
  CrmDeleteLabelRequestType req;
  
  aliyun::CrmDeleteLabelRequestType::CrmDeleteLabelRequestType
            ((CrmDeleteLabelRequestType *)((long)&resp.result.field_2 + 8));
  aliyun::CrmDeleteLabelResponseType::CrmDeleteLabelResponseType((CrmDeleteLabelResponseType *)&crm)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"cn-hangzhou",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"my_appid",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"my_secret",&local_111);
  pCVar2 = (CrmDeleteLabelRequestType *)aliyun::Crm::CreateCrmClient(local_b0,local_e8,local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = pCVar2;
  if (pCVar2 == (CrmDeleteLabelRequestType *)0x0) {
    aliyun::CrmDeleteLabelResponseType::~CrmDeleteLabelResponseType
              ((CrmDeleteLabelResponseType *)&crm);
    aliyun::CrmDeleteLabelRequestType::~CrmDeleteLabelRequestType
              ((CrmDeleteLabelRequestType *)((long)&resp.result.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Crm::SetProxyHost((Crm *)pCVar2,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Crm::SetUseTls((Crm *)local_90,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_delete_label_response;
  local_148 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_169);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_169);
  HttpTestListener::Start(local_148);
  std::__cxx11::string::operator=((string *)(resp.result.field_2._M_local_buf + 8),"PK");
  std::__cxx11::string::operator=((string *)(req.pk.field_2._M_local_buf + 8),"LabelName");
  std::__cxx11::string::operator=((string *)(req.label_name.field_2._M_local_buf + 8),"LabelSeries")
  ;
  aliyun::Crm::DeleteLabel
            (local_90,(CrmDeleteLabelResponseType *)((long)&resp.result.field_2 + 8),
             (CrmErrorInfo *)&crm);
  HttpTestListener::WaitComplete(local_148);
  pHVar3 = local_148;
  if (local_148 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_148);
    operator_delete(pHVar3,0x180);
  }
  pCVar2 = local_90;
  if (local_90 != (CrmDeleteLabelRequestType *)0x0) {
    aliyun::Crm::~Crm((Crm *)local_90);
    operator_delete(pCVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_delete_label() {
  CrmDeleteLabelRequestType req;
  CrmDeleteLabelResponseType resp;
  Crm* crm = Crm::CreateCrmClient("cn-hangzhou", "my_appid", "my_secret");
  if(!crm) return 0;
  crm->SetProxyHost("127.0.0.1:12234");
  crm->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_delete_label_response);
  listener->Start();
  req.pk = "PK";
  req.label_name = "LabelName";
  req.label_series = "LabelSeries";
  int ret = crm->DeleteLabel(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete crm;
}